

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall
tetgenmesh::checkfac4split(tetgenmesh *this,face *chkfac,point *encpt,int *qflag,double *cent)

{
  tetrahedron ppdVar1;
  shellface *pppdVar2;
  shellface ppdVar3;
  shellface ppdVar4;
  shellface ppdVar5;
  bool bVar6;
  uint uVar7;
  tetgenbehavior *ptVar8;
  tetrahedron ppdVar9;
  int iVar10;
  tetgenmesh *this_00;
  ulong uVar11;
  double __x;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_150;
  triface searchtet;
  int indx [4];
  double D;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double local_98;
  double dStack_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  
  *encpt = (point)0x0;
  *qflag = 0;
  pppdVar2 = chkfac->sh;
  iVar10 = chkfac->shver;
  ppdVar3 = pppdVar2[sorgpivot[iVar10]];
  ppdVar4 = pppdVar2[sdestpivot[iVar10]];
  ppdVar5 = pppdVar2[sapexpivot[iVar10]];
  local_b8 = (double)*ppdVar4 - (double)*ppdVar3;
  dStack_b0 = (double)ppdVar4[1] - (double)ppdVar3[1];
  local_98 = (double)*ppdVar5 - (double)*ppdVar3;
  dStack_90 = (double)ppdVar5[1] - (double)ppdVar3[1];
  local_a8 = (double)ppdVar4[2] - (double)ppdVar3[2];
  local_88 = (double)ppdVar5[2] - (double)ppdVar3[2];
  local_68 = local_b8 * dStack_90 - dStack_b0 * local_98;
  local_78 = dStack_b0 * local_88 - dStack_90 * local_a8;
  dVar16 = local_88 * local_b8 - local_a8 * local_98;
  local_70 = -dVar16;
  dVar14 = local_78 * local_78;
  dVar15 = local_68 * local_68;
  local_d8 = (local_a8 * local_a8 + local_b8 * local_b8 + dStack_b0 * dStack_b0) * 0.5;
  dStack_d0 = (local_88 * local_88 + local_98 * local_98 + dStack_90 * dStack_90) * 0.5;
  local_c8 = 0.0;
  this_00 = this;
  bVar6 = lu_decmp(this,(double (*) [4])&local_b8,3,indx,&D,0);
  if (!bVar6) {
    this_00 = this;
    terminatetetgen(this,2);
  }
  __x = SQRT(dVar15 + dVar14 + dVar16 * dVar16) * 0.5;
  lu_solve(this_00,(double (*) [4])&local_b8,3,indx,&local_d8,0);
  dVar16 = local_c8;
  dVar15 = dStack_d0;
  dVar14 = local_d8;
  *cent = (double)*ppdVar3 + local_d8;
  cent[1] = (double)ppdVar3[1] + dStack_d0;
  cent[2] = (double)ppdVar3[2] + local_c8;
  if (((this->checkconstraints == 0) || ((double)chkfac->sh[this->areaboundindex] <= 0.0)) ||
     (__x <= (double)chkfac->sh[this->areaboundindex])) {
    ptVar8 = this->b;
    if (ptVar8->fixedvolume != 0) {
      if (__x < 0.0) {
        dVar12 = sqrt(__x);
      }
      else {
        dVar12 = SQRT(__x);
      }
      ptVar8 = this->b;
      if (ptVar8->maxvolume <= dVar12 * __x && dVar12 * __x != ptVar8->maxvolume) goto LAB_0013b6c2;
    }
    if (ptVar8->varvolume != 0) {
      searchtet.tet = (tetrahedron *)0x0;
      searchtet.ver = 0;
      stpivot(this,chkfac,&searchtet);
      ppdVar9 = searchtet.tet[7];
      if ((ppdVar9 != (tetrahedron)this->dummypoint) &&
         (ppdVar1 = searchtet.tet[this->volumeboundindex], ppdVar9 = (tetrahedron)this->dummypoint,
         0.0 < (double)ppdVar1)) {
        if (__x < 0.0) {
          dVar12 = sqrt(__x);
        }
        else {
          dVar12 = SQRT(__x);
        }
        if ((double)ppdVar1 < dVar12 * __x) goto LAB_0013b6c2;
        ppdVar9 = (tetrahedron)this->dummypoint;
      }
      if ((*(tetrahedron *)(((ulong)searchtet.tet[searchtet.ver & 3] & 0xfffffffffffffff0) + 0x38)
           != ppdVar9) &&
         (dVar12 = *(double *)
                    (((ulong)searchtet.tet[searchtet.ver & 3] & 0xfffffffffffffff0) +
                    (long)this->volumeboundindex * 8), 0.0 < dVar12)) {
        if (__x < 0.0) {
          dVar13 = sqrt(__x);
        }
        else {
          dVar13 = SQRT(__x);
        }
        if (dVar12 < __x * dVar13) goto LAB_0013b6c2;
      }
      ptVar8 = this->b;
    }
    dVar14 = SQRT(dVar16 * dVar16 + dVar14 * dVar14 + dVar15 * dVar15);
    if (ptVar8->metric != 0) {
      iVar10 = this->pointmtrindex;
      if ((((0.0 < (double)ppdVar3[iVar10]) && ((double)ppdVar3[iVar10] < dVar14)) ||
          ((0.0 < (double)ppdVar4[iVar10] && ((double)ppdVar4[iVar10] < dVar14)))) ||
         ((0.0 < (double)ppdVar5[iVar10] && ((double)ppdVar5[iVar10] < dVar14)))) goto LAB_0013b6c2;
    }
    searchtet.tet = (tetrahedron *)0x0;
    iVar10 = 2;
    searchtet.ver = 0;
    local_150 = 0.0;
    while (bVar6 = iVar10 != 0, iVar10 = iVar10 + -1, bVar6) {
      stpivot(this,chkfac,&searchtet);
      if (searchtet.tet[7] != (tetrahedron)this->dummypoint) {
        dVar15 = distance(this,(double *)searchtet.tet[oppopivot[searchtet.ver]],cent);
        uVar11 = -(ulong)(ABS(dVar15 - dVar14) / dVar14 < this->b->epsilon);
        dVar15 = (double)(uVar11 & (ulong)dVar14 | ~uVar11 & (ulong)dVar15);
        if ((dVar15 < dVar14) && (((local_150 == 0.0 && (!NAN(local_150))) || (dVar15 < local_150)))
           ) {
          *encpt = (point)searchtet.tet[oppopivot[searchtet.ver]];
          local_150 = dVar15;
        }
      }
      *(byte *)&chkfac->shver = (byte)chkfac->shver ^ 1;
    }
    uVar7 = (uint)(*encpt != (point)0x0);
  }
  else {
LAB_0013b6c2:
    *qflag = 1;
    uVar7 = 1;
  }
  return uVar7;
}

Assistant:

int tetgenmesh::checkfac4split(face *chkfac, point& encpt, int& qflag, 
                               REAL *cent)
{
  point pa, pb, pc;
  REAL area, rd, len;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i;

  encpt = NULL;
  qflag = 0;

  pa = sorg(*chkfac);
  pb = sdest(*chkfac);
  pc = sapex(*chkfac);

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
  cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

  area = 0.5 * sqrt(dot(A[2], A[2])); // The area of [a,b,c].

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]); // edge [a,b]
  rhs[1] = 0.5 * dot(A[1], A[1]); // edge [a,c]
  rhs[2] = 0.0;

  // Solve the 3 by 3 equations use LU decomposition with partial 
  //   pivoting and backward and forward substitute.
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerate triangle. 
    terminatetetgen(this, 2);
  }

  lu_solve(A, 3, indx, rhs, 0);
  cent[0] = pa[0] + rhs[0];
  cent[1] = pa[1] + rhs[1];
  cent[2] = pa[2] + rhs[2];
  rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

  if (checkconstraints && (areabound(*chkfac) > 0.0)) {
    // Check if the subface has too big area.
    if (area > areabound(*chkfac)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((area * sqrt(area)) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->varvolume) {
    triface adjtet;
    REAL volbnd;
    int t1ver;

    stpivot(*chkfac, adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
    fsymself(adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((pa[pointmtrindex] > 0) && (rd > pa[pointmtrindex])) ||
        ((pb[pointmtrindex] > 0) && (rd > pb[pointmtrindex])) ||
        ((pc[pointmtrindex] > 0) && (rd > pc[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }

  triface searchtet;
  REAL smlen = 0;

  // Check if this subface is locally encroached.
  for (i = 0; i < 2; i++) {
    stpivot(*chkfac, searchtet);
    if (!ishulltet(searchtet)) {
      len = distance(oppo(searchtet), cent);
      if ((fabs(len - rd) / rd) < b->epsilon) len = rd;// Rounding.
      if (len < rd) {
        if (smlen == 0) {
          smlen = len;
          encpt = oppo(searchtet);
        } else {
          if (len < smlen) {
            smlen = len;
            encpt = oppo(searchtet);
          }
        }
        //return 1;
      }
    }
    sesymself(*chkfac);
  }

  return encpt != NULL; //return 0;
}